

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

char * FindModuleCodeWithSourceLocation(ExpressionContext *ctx,char *position)

{
  bool bVar1;
  size_t sVar2;
  ModuleData **ppMVar3;
  char *pcVar4;
  uint index;
  
  pcVar4 = ctx->code;
  if ((pcVar4 <= position) && (sVar2 = strlen(pcVar4), position <= pcVar4 + sVar2)) {
    return pcVar4;
  }
  index = 0;
  while( true ) {
    if ((ctx->imports).count <= index) {
      return (char *)0x0;
    }
    ppMVar3 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->imports,index);
    bVar1 = HasSourceCode((*ppMVar3)->bytecode,position);
    if (bVar1) break;
    index = index + 1;
  }
  ppMVar3 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->imports,index);
  pcVar4 = FindSource((*ppMVar3)->bytecode);
  return pcVar4;
}

Assistant:

const char* FindModuleCodeWithSourceLocation(ExpressionContext &ctx, const char *position)
{
	if(position >= ctx.code && position <= ctx.code + strlen(ctx.code))
		return ctx.code;

	for(unsigned i = 0; i < ctx.imports.size(); i++)
	{
		if(HasSourceCode(ctx.imports[i]->bytecode, position))
			return FindSource(ctx.imports[i]->bytecode);
	}

	return NULL;
}